

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

void __thiscall SQInstance::Release(SQInstance *this)

{
  undefined8 *in_RDI;
  SQInteger size;
  void *p;
  
  in_RDI[1] = in_RDI[1] + 1;
  if (in_RDI[9] != 0) {
    (*(code *)in_RDI[9])(in_RDI[8],0);
  }
  in_RDI[1] = in_RDI[1] + -1;
  if (in_RDI[1] == 0) {
    p = (void *)in_RDI[10];
    (**(code **)*in_RDI)();
    sq_vm_free(p,(SQUnsignedInteger)in_RDI);
  }
  return;
}

Assistant:

void Release() {
        _uiRef++;
        if (_hook) { _hook(_userpointer,0);}
        _uiRef--;
        if(_uiRef > 0) return;
        SQInteger size = _memsize;
        this->~SQInstance();
        SQ_FREE(this, size);
    }